

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

void av1_cnn_add_c(float **output,int channels,int width,int height,int stride,float **add)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (0 < channels) {
    uVar4 = 0;
    do {
      if (0 < height) {
        lVar3 = 0;
        uVar6 = 0;
        do {
          if (0 < width) {
            pfVar1 = add[uVar4];
            pfVar2 = output[uVar4];
            uVar5 = 0;
            do {
              *(float *)((long)pfVar2 + uVar5 * 4 + lVar3) =
                   *(float *)((long)pfVar1 + uVar5 * 4 + lVar3) +
                   *(float *)((long)pfVar2 + uVar5 * 4 + lVar3);
              uVar5 = uVar5 + 1;
            } while ((uint)width != uVar5);
          }
          uVar6 = uVar6 + 1;
          lVar3 = lVar3 + (long)stride * 4;
        } while (uVar6 != (uint)height);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)channels);
  }
  return;
}

Assistant:

void av1_cnn_add_c(float **output, int channels, int width, int height,
                   int stride, const float **add) {
  for (int c = 0; c < channels; ++c) {
    for (int i = 0; i < height; ++i)
      for (int j = 0; j < width; ++j)
        output[c][i * stride + j] += add[c][i * stride + j];
  }
}